

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool duckdb::NegatePropagateStatistics::Operation<signed_char>
               (LogicalType *type,BaseStatistics *istats,Value *new_min,Value *new_max)

{
  char cVar1;
  char cVar2;
  char cast_1;
  char cast;
  Value local_70;
  
  cVar1 = NumericStats::GetMax<signed_char>(istats);
  cVar2 = NumericStats::GetMin<signed_char>(istats);
  if (cVar1 != -0x80 && cVar2 != -0x80) {
    Value::Numeric(&local_70,type,(long)-cVar1);
    Value::operator=(new_min,&local_70);
    Value::~Value(&local_70);
    Value::Numeric(&local_70,type,(long)-cVar2);
    Value::operator=(new_max,&local_70);
    Value::~Value(&local_70);
  }
  return cVar1 == -0x80 || cVar2 == -0x80;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &istats, Value &new_min, Value &new_max) {
		auto max_value = NumericStats::GetMax<T>(istats);
		auto min_value = NumericStats::GetMin<T>(istats);
		if (!NegateOperator::CanNegate<T>(min_value) || !NegateOperator::CanNegate<T>(max_value)) {
			return true;
		}
		// new min is -max
		new_min = Value::Numeric(type, NegateOperator::Operation<T, T>(max_value));
		// new max is -min
		new_max = Value::Numeric(type, NegateOperator::Operation<T, T>(min_value));
		return false;
	}